

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_pre_check_results.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_152aa7::Json2Array<aliyun::RdsDescribePreCheckResultsPreCheckResultType>::
Json2Array(Json2Array<aliyun::RdsDescribePreCheckResultsPreCheckResultType> *this,Value *value,
          vector<aliyun::RdsDescribePreCheckResultsPreCheckResultType,_std::allocator<aliyun::RdsDescribePreCheckResultsPreCheckResultType>_>
          *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_a8 [8];
  RdsDescribePreCheckResultsPreCheckResultType val;
  int i;
  vector<aliyun::RdsDescribePreCheckResultsPreCheckResultType,_std::allocator<aliyun::RdsDescribePreCheckResultsPreCheckResultType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribePreCheckResultsPreCheckResultType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.repair_method.field_2._12_4_ = 0; uVar1 = val.repair_method.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.repair_method.field_2._12_4_ = val.repair_method.field_2._12_4_ + 1) {
      aliyun::RdsDescribePreCheckResultsPreCheckResultType::
      RdsDescribePreCheckResultsPreCheckResultType
                ((RdsDescribePreCheckResultsPreCheckResultType *)local_a8);
      value_00 = Json::Value::operator[](value,val.repair_method.field_2._12_4_);
      anon_unknown.dwarf_152aa7::Json2Type
                (value_00,(RdsDescribePreCheckResultsPreCheckResultType *)local_a8);
      std::
      vector<aliyun::RdsDescribePreCheckResultsPreCheckResultType,_std::allocator<aliyun::RdsDescribePreCheckResultsPreCheckResultType>_>
      ::push_back(vec,(value_type *)local_a8);
      aliyun::RdsDescribePreCheckResultsPreCheckResultType::
      ~RdsDescribePreCheckResultsPreCheckResultType
                ((RdsDescribePreCheckResultsPreCheckResultType *)local_a8);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }